

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Periodicity.cpp
# Opt level: O2

Box * __thiscall amrex::Periodicity::Domain(Periodicity *this)

{
  int iVar1;
  int i;
  long lVar2;
  Box *in_RDI;
  int iVar3;
  
  (in_RDI->smallend).vect[0] = 1;
  (in_RDI->smallend).vect[1] = 1;
  (in_RDI->smallend).vect[2] = 1;
  (in_RDI->bigend).vect[0] = 0;
  (in_RDI->bigend).vect[1] = 0;
  *(undefined8 *)((in_RDI->bigend).vect + 2) = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    iVar1 = (this->period).vect[lVar2];
    iVar3 = iVar1 + -1;
    if (iVar1 < 1) {
      iVar3 = 0x7ffffffe;
    }
    (in_RDI->smallend).vect[lVar2] = (uint)(iVar1 < 1) << 0x1f;
    (in_RDI->bigend).vect[lVar2] = iVar3;
  }
  return in_RDI;
}

Assistant:

Box
Periodicity::Domain () const noexcept
{
    Box pdomain;
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (isPeriodic(i)) {
            pdomain.setSmall(i,0);
            pdomain.setBig  (i,period[i]-1);
        } else {
            pdomain.setSmall(i, std::numeric_limits<int>::min());
            pdomain.setBig(i, std::numeric_limits<int>::max()-1); // so that it can be nodalized.
        }
    }
    return pdomain;
}